

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O1

void __thiscall
backend::codegen::RegAllocator::replace_read
          (RegAllocator *this,Reg *r,int i,optional<unsigned_int> pre_alloc_transient)

{
  Reg *pRVar1;
  _Variadic_union<arm::RegisterOperand,_short> *p_Var2;
  _Variadic_union<arm::RegisterOperand,_short> *p_Var3;
  ConditionCode CVar4;
  uint uVar5;
  pointer puVar6;
  Inst *pIVar7;
  pointer puVar8;
  bool bVar9;
  Reg RVar10;
  __node_base_ptr p_Var11;
  __node_base_ptr p_Var12;
  undefined4 extraout_var;
  ostream *poVar13;
  _func_int **pp_Var14;
  mapped_type *pmVar15;
  Tag *pTVar16;
  char *pcVar17;
  Interval i_00;
  MemoryOperand *other;
  Interval i_01;
  MemoryOperand *this_00;
  pointer __p;
  _Hash_node_base *p_Var18;
  pointer *__ptr;
  _Optional_payload_base<unsigned_int> _Var19;
  anon_class_8_2_9473111c disp_reg;
  ostream local_129;
  undefined1 local_128 [32];
  anon_class_8_1_a78179b7_conflict10 local_108;
  Displayable local_100;
  _Variadic_union<arm::RegisterOperand,_short> local_f8;
  undefined **local_e8;
  undefined8 local_e0;
  _Variadic_union<arm::RegisterOperand,_short> local_d8;
  undefined1 local_c8;
  bool local_c0;
  _Optional_payload_base<unsigned_int> local_b8;
  int local_ac;
  anon_class_8_2_9473111c local_a8;
  undefined1 local_a0 [16];
  _Move_ctor_base<false,_arm::RegisterOperand,_short> local_90;
  _Alloc_hider local_78;
  size_type local_70;
  _Variadic_union<arm::RegisterOperand,_short> local_68;
  size_t local_58;
  bool local_50;
  _Head_base<0UL,_arm::LoadStoreInst_*,_false> local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  local_a8.r = *r;
  pTVar16 = (Tag *)(ulong)local_a8.r;
  local_a8.i = i;
  RVar10 = get_collapse_reg(this,local_a8.r);
  *r = RVar10;
  if (RVar10 < 0x40) {
    replace_read::anon_class_8_2_9473111c::operator()(&local_a8);
    local_129 = (ostream)0x0;
    AixLog::operator<<(&local_129,(Severity *)pTVar16);
    pRVar1 = &local_d8._M_first._M_storage.reg;
    local_e8 = &PTR__Tag_001edee0;
    local_d8._M_first._M_storage.super_Displayable._vptr_Displayable =
         (Displayable)(_func_int **)0x0;
    local_d8._M_first._M_storage.reg._0_1_ = 0;
    local_c0 = true;
    local_e0 = pRVar1;
    AixLog::operator<<((ostream *)&local_e8,pTVar16);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)pTVar16);
    local_108.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"replace_read","");
    p_Var2 = (_Variadic_union<arm::RegisterOperand,_short> *)(local_128 + 0x10);
    pcVar17 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_128._0_8_ = p_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,"");
    local_a0._8_8_ =
         (long)&local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u + 8;
    local_a0._0_8_ = &PTR__Function_001edf10;
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_108.__lhs == &local_f8) {
      local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
      super__Variant_storage_alias<arm::RegisterOperand,_short>._16_8_ = local_f8._8_8_;
    }
    else {
      local_a0._8_8_ = local_108.__lhs;
    }
    local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._9_7_ = local_f8._1_7_;
    local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._8_1_ = local_f8._M_rest._0_1_;
    local_78._M_p = (pointer)&local_68;
    local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._M_first._M_storage.
    super_Displayable._vptr_Displayable = (Displayable)(Displayable)local_100._vptr_Displayable;
    local_100._vptr_Displayable = (_func_int **)0x0;
    local_f8._M_rest._M_first._M_storage._0_1_ = 0;
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128._0_8_ == p_Var2) {
      local_68._8_8_ = local_128._24_8_;
    }
    else {
      local_78._M_p = (pointer)local_128._0_8_;
    }
    local_68._1_7_ = local_128._17_7_;
    local_68._M_rest._M_first._M_storage._0_1_ = local_128[0x10];
    local_70 = local_128._8_8_;
    local_128[8] = None;
    local_128._9_3_ = 0;
    local_128._12_4_ = 0;
    local_128[0x10] = 0;
    local_58 = 0x26f;
    local_50 = false;
    local_128._0_8_ = p_Var2;
    local_108.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_f8;
    AixLog::operator<<((ostream *)local_a0,(Function *)pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"phys",4);
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    AixLog::Function::~Function((Function *)local_a0);
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128._0_8_ != p_Var2) {
      operator_delete((void *)local_128._0_8_,CONCAT71(local_128._17_7_,local_128[0x10]) + 1);
    }
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_108.__lhs != &local_f8) {
      operator_delete(local_108.__lhs,
                      CONCAT71(local_f8._1_7_,local_f8._M_rest._M_first._M_storage._0_1_) + 1);
    }
    if (local_e0 == pRVar1) {
      return;
    }
LAB_001767ee:
    local_e8 = &PTR__Tag_001edee0;
    operator_delete(local_e0,CONCAT71(local_d8._9_7_,local_d8._M_first._M_storage.reg._0_1_) + 1);
    return;
  }
  p_Var18 = (_Hash_node_base *)0x0;
  pTVar16 = (Tag *)((ulong)RVar10 % (this->reg_map)._M_h._M_bucket_count);
  p_Var11 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_find_before_node(&(this->reg_map)._M_h,(size_type)pTVar16,r,(ulong)RVar10);
  if (p_Var11 != (__node_base_ptr)0x0) {
    p_Var18 = p_Var11->_M_nxt;
  }
  if (p_Var18 != (_Hash_node_base *)0x0) {
    replace_read::anon_class_8_2_9473111c::operator()(&local_a8);
    local_129 = (ostream)0x0;
    AixLog::operator<<(&local_129,(Severity *)pTVar16);
    pRVar1 = &local_d8._M_first._M_storage.reg;
    local_e8 = &PTR__Tag_001edee0;
    local_d8._M_first._M_storage.super_Displayable._vptr_Displayable =
         (Displayable)(_func_int **)0x0;
    local_d8._M_first._M_storage.reg._0_1_ = 0;
    local_c0 = true;
    local_e0 = pRVar1;
    AixLog::operator<<((ostream *)&local_e8,pTVar16);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)pTVar16);
    local_108.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"replace_read","");
    p_Var2 = (_Variadic_union<arm::RegisterOperand,_short> *)(local_128 + 0x10);
    pcVar17 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_128._0_8_ = p_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,"");
    local_a0._8_8_ =
         (long)&local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u + 8;
    local_a0._0_8_ = &PTR__Function_001edf10;
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_108.__lhs == &local_f8) {
      local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
      super__Variant_storage_alias<arm::RegisterOperand,_short>._16_8_ = local_f8._8_8_;
    }
    else {
      local_a0._8_8_ = local_108.__lhs;
    }
    local_78._M_p = (pointer)&local_68;
    local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._M_first._M_storage.
    super_Displayable._vptr_Displayable = (Displayable)(Displayable)local_100._vptr_Displayable;
    local_100._vptr_Displayable = (_func_int **)0x0;
    local_f8._M_rest._M_first._M_storage._0_1_ = 0;
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128._0_8_ == p_Var2) {
      local_68._8_8_ = local_128._24_8_;
    }
    else {
      local_78._M_p = (pointer)local_128._0_8_;
    }
    local_70 = local_128._8_8_;
    local_128[8] = None;
    local_128._9_3_ = 0;
    local_128._12_4_ = 0;
    local_128[0x10] = 0;
    local_58 = 0x274;
    local_50 = false;
    local_128._0_8_ = p_Var2;
    local_108.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_f8;
    AixLog::operator<<((ostream *)local_a0,(Function *)pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"graph ",6);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    AixLog::Function::~Function((Function *)local_a0);
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128._0_8_ != p_Var2) {
      operator_delete((void *)local_128._0_8_,CONCAT71(local_128._17_7_,local_128[0x10]) + 1);
    }
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_108.__lhs != &local_f8) {
      operator_delete(local_108.__lhs,
                      CONCAT71(local_f8._1_7_,local_f8._M_rest._M_first._M_storage._0_1_) + 1);
    }
    local_e8 = &PTR__Tag_001edee0;
    if (local_e0 != pRVar1) {
      operator_delete(local_e0,CONCAT71(local_d8._9_7_,local_d8._M_first._M_storage.reg._0_1_) + 1);
    }
    *r = *(Reg *)((long)&p_Var18[1]._M_nxt + 4);
    return;
  }
  p_Var18 = (_Hash_node_base *)0x0;
  local_b8 = (_Optional_payload_base<unsigned_int>)
             pre_alloc_transient.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>;
  p_Var12 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_find_before_node
                      (&(this->spilled_regs)._M_h,
                       (ulong)*r % (this->spilled_regs)._M_h._M_bucket_count,r,(ulong)*r);
  if (p_Var12 != (__node_base_ptr)0x0) {
    p_Var18 = p_Var12->_M_nxt;
  }
  if (p_Var18 == (_Hash_node_base *)0x0) {
    pmVar15 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->live_intervals,r);
    i_01.start = pmVar15->start;
    i_01.end = pmVar15->end;
    RVar10 = alloc_transient_reg(this,i_01,(optional<unsigned_int>)((ulong)*r | 0x100000000));
    *r = RVar10;
    replace_read::anon_class_8_2_9473111c::operator()(&local_a8);
    local_129 = (ostream)0x0;
    AixLog::operator<<(&local_129,(Severity *)i_01);
    local_e0 = &local_d8._M_first._M_storage.reg;
    local_e8 = &PTR__Tag_001edee0;
    local_d8._M_first._M_storage.super_Displayable._vptr_Displayable =
         (Displayable)(_func_int **)0x0;
    local_d8._M_first._M_storage.reg._0_1_ = 0;
    local_c0 = true;
    AixLog::operator<<((ostream *)&local_e8,(Tag *)i_01);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)i_01);
    local_108.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"replace_read","");
    p_Var2 = (_Variadic_union<arm::RegisterOperand,_short> *)(local_128 + 0x10);
    pcVar17 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_128._0_8_ = p_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,"");
    p_Var3 = (_Variadic_union<arm::RegisterOperand,_short> *)
             ((long)&local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                     super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u + 8);
    local_a0._0_8_ = &PTR__Function_001edf10;
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_108.__lhs == &local_f8) {
      local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
      super__Variant_storage_alias<arm::RegisterOperand,_short>._16_8_ = local_f8._8_8_;
      local_a0._8_8_ = p_Var3;
    }
    else {
      local_a0._8_8_ = local_108.__lhs;
    }
    local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._M_first._M_storage.
    super_Displayable._vptr_Displayable = (Displayable)(Displayable)local_100._vptr_Displayable;
    local_100._vptr_Displayable = (_func_int **)0x0;
    local_f8._M_rest._M_first._M_storage._0_1_ = 0;
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128._0_8_ == p_Var2) {
      local_68._8_8_ = local_128._24_8_;
      local_78._M_p = (pointer)&local_68;
    }
    else {
      local_78._M_p = (pointer)local_128._0_8_;
    }
    local_70 = local_128._8_8_;
    local_128._8_8_ = 0;
    local_128[0x10] = 0;
    local_58 = 0x2a3;
    local_50 = false;
    local_128._0_8_ = p_Var2;
    local_108.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_f8;
    AixLog::operator<<((ostream *)local_a0,(Function *)pcVar17);
    pcVar17 = "transient ";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"transient ",10);
    AixLog::Function::~Function((Function *)local_a0);
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128._0_8_ != p_Var2) {
      pcVar17 = (char *)(CONCAT71(local_128._17_7_,local_128[0x10]) + 1);
      operator_delete((void *)local_128._0_8_,(ulong)pcVar17);
    }
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_108.__lhs != &local_f8) {
      pcVar17 = (char *)(CONCAT71(local_f8._1_7_,local_f8._M_rest._M_first._M_storage._0_1_) + 1);
      operator_delete(local_108.__lhs,(ulong)pcVar17);
    }
    local_e8 = &PTR__Tag_001edee0;
    if (local_e0 != &local_d8._M_first._M_storage.reg) {
      pcVar17 = (char *)(CONCAT71(local_d8._9_7_,local_d8._M_first._M_storage.reg._0_1_) + 1);
      operator_delete(local_e0,(ulong)pcVar17);
    }
    local_129 = (ostream)0x0;
    AixLog::operator<<(&local_129,(Severity *)pcVar17);
    local_e8 = &PTR__Tag_001edee0;
    local_e0 = &local_d8._M_first._M_storage.reg;
    local_d8._M_first._M_storage.super_Displayable._vptr_Displayable =
         (Displayable)(_func_int **)0x0;
    local_d8._M_first._M_storage.reg._0_1_ = 0;
    local_c0 = true;
    AixLog::operator<<((ostream *)&local_e8,(Tag *)pcVar17);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)pcVar17);
    local_108.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"replace_read","");
    pcVar17 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_128._0_8_ = p_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,"");
    local_a0._0_8_ = &PTR__Function_001edf10;
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_108.__lhs == &local_f8) {
      local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
      super__Variant_storage_alias<arm::RegisterOperand,_short>._16_8_ = local_f8._8_8_;
      local_a0._8_8_ = p_Var3;
    }
    else {
      local_a0._8_8_ = local_108.__lhs;
    }
    local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._9_7_ = local_f8._1_7_;
    local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._8_1_ = local_f8._M_rest._0_1_;
    local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._M_first._M_storage.
    super_Displayable._vptr_Displayable = (Displayable)(Displayable)local_100._vptr_Displayable;
    local_100._vptr_Displayable = (_func_int **)0x0;
    local_f8._M_rest._M_first._M_storage._0_1_ = 0;
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128._0_8_ == p_Var2) {
      local_68._8_8_ = local_128._24_8_;
      local_78._M_p = (pointer)&local_68;
    }
    else {
      local_78._M_p = (pointer)local_128._0_8_;
    }
    local_68._1_7_ = local_128._17_7_;
    local_68._M_rest._M_first._M_storage._0_1_ = local_128[0x10];
    local_70 = local_128._8_8_;
    local_128._8_8_ = 0;
    local_128[0x10] = 0;
    local_58 = 0x2a4;
    local_50 = false;
    local_128._0_8_ = p_Var2;
    local_108.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_f8;
    AixLog::operator<<((ostream *)local_a0,(Function *)pcVar17);
    pTVar16 = (Tag *)(ulong)*r;
    arm::display_reg_name((ostream *)&std::clog,*r);
    AixLog::Function::~Function((Function *)local_a0);
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128._0_8_ != p_Var2) {
      pTVar16 = (Tag *)(CONCAT71(local_128._17_7_,local_128[0x10]) + 1);
      operator_delete((void *)local_128._0_8_,(ulong)pTVar16);
    }
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_108.__lhs != &local_f8) {
      pTVar16 = (Tag *)(CONCAT71(local_f8._1_7_,local_f8._M_rest._M_first._M_storage._0_1_) + 1);
      operator_delete(local_108.__lhs,(ulong)pTVar16);
    }
    local_e8 = &PTR__Tag_001edee0;
    if (local_e0 != &local_d8._M_first._M_storage.reg) {
      pTVar16 = (Tag *)(CONCAT71(local_d8._9_7_,local_d8._M_first._M_storage.reg._0_1_) + 1);
      operator_delete(local_e0,(ulong)pTVar16);
    }
    local_129 = (ostream)0x0;
    AixLog::operator<<(&local_129,(Severity *)pTVar16);
    local_e8 = &PTR__Tag_001edee0;
    local_e0 = &local_d8._M_first._M_storage.reg;
    local_d8._M_first._M_storage.super_Displayable._vptr_Displayable =
         (Displayable)(_func_int **)0x0;
    local_d8._M_first._M_storage.reg._0_1_ = 0;
    local_c0 = true;
    AixLog::operator<<((ostream *)&local_e8,pTVar16);
    local_40 = std::chrono::_V2::system_clock::now();
    local_48._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
    local_38 = 0;
    AixLog::operator<<((ostream *)&local_48,(Timestamp *)pTVar16);
    local_108.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"replace_read","");
    pcVar17 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_128._0_8_ = p_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,"");
    local_a0._0_8_ = &PTR__Function_001edf10;
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_108.__lhs == &local_f8) {
      local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
      super__Variant_storage_alias<arm::RegisterOperand,_short>._16_8_ = local_f8._8_8_;
      local_a0._8_8_ = p_Var3;
    }
    else {
      local_a0._8_8_ = local_108.__lhs;
    }
    local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._9_7_ = local_f8._1_7_;
    local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._8_1_ = local_f8._M_rest._0_1_;
    local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._M_first._M_storage.
    super_Displayable._vptr_Displayable = (Displayable)(Displayable)local_100._vptr_Displayable;
    local_100._vptr_Displayable = (_func_int **)0x0;
    local_f8._M_rest._M_first._M_storage._0_1_ = 0;
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128._0_8_ == p_Var2) {
      local_68._8_8_ = local_128._24_8_;
      local_78._M_p = (pointer)&local_68;
    }
    else {
      local_78._M_p = (pointer)local_128._0_8_;
    }
    local_68._1_7_ = local_128._17_7_;
    local_68._M_rest._M_first._M_storage._0_1_ = local_128[0x10];
    local_70 = local_128._8_8_;
    local_128[8] = None;
    local_128._9_3_ = 0;
    local_128._12_4_ = 0;
    local_128[0x10] = 0;
    local_58 = 0x2a5;
    local_50 = false;
    local_128._0_8_ = p_Var2;
    local_108.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_f8;
    AixLog::operator<<((ostream *)local_a0,(Function *)pcVar17);
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    AixLog::Function::~Function((Function *)local_a0);
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128._0_8_ != p_Var2) {
      operator_delete((void *)local_128._0_8_,CONCAT71(local_128._17_7_,local_128[0x10]) + 1);
    }
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_108.__lhs != &local_f8) {
      operator_delete(local_108.__lhs,
                      CONCAT71(local_f8._1_7_,local_f8._M_rest._M_first._M_storage._0_1_) + 1);
    }
    if (local_e0 == &local_d8._M_first._M_storage.reg) {
      return;
    }
    goto LAB_001767ee;
  }
  local_ac = get_or_alloc_spill_pos(this,*r);
  uVar5 = *(uint *)&p_Var18[2]._M_nxt;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->spilled_regs)._M_h,r);
  if (((ulong)local_b8 & 0x100000000) == 0) {
    i_00.end = uVar5;
    i_00.start = i;
    local_b8._M_payload._M_value =
         alloc_transient_reg(this,i_00,(optional<unsigned_int>)((ulong)*r | 0x100000000));
    local_b8._4_4_ = extraout_var;
  }
  puVar6 = (this->inst_sink).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((puVar6 != (this->inst_sink).
                 super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) &&
     (pIVar7 = puVar6[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
               _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl,
     (pIVar7->super_Displayable)._vptr_Displayable == (_func_int **)&PTR_display_001f09c8)) {
    this_00 = (MemoryOperand *)0x0;
    if ((char)pIVar7[4].op == B) {
      this_00 = (MemoryOperand *)&pIVar7[1].op;
    }
    if ((pIVar7->op == StR) &&
       (*(uint *)&pIVar7[1].super_Displayable._vptr_Displayable == local_b8._M_payload._M_value)) {
      other = (MemoryOperand *)local_a0;
      local_a0._0_8_ = &PTR_display_001f0808;
      local_a0._8_4_ = (uint)local_a0._8_8_ & 0xffffff00;
      local_a0._12_4_ = 0xd;
      local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
      super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._M_rest =
           (_Variadic_union<short>)((short)this->stack_offset + (short)local_ac);
      local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
      super__Variant_storage_alias<arm::RegisterOperand,_short>._M_index = '\x01';
      bVar9 = arm::MemoryOperand::operator==(this_00,other);
      if ((bVar9) &&
         ((puVar6[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
           super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
           super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl)->cond == this->cur_cond)) {
        puVar8 = (this->inst_sink).
                 super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar6 = puVar8 + -1;
        (this->inst_sink).
        super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar6;
        pIVar7 = puVar8[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                 _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
        if (pIVar7 != (Inst *)0x0) {
          (*(pIVar7->super_Displayable)._vptr_Displayable[2])();
        }
        (puVar6->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
        super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
        super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = (Inst *)0x0;
        _Var19 = local_b8;
        if ((this->delayed_store).
            super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
            super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged == true)
        {
          (this->delayed_store).
          super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
          super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_payload._M_value.
          first = *r;
          (this->delayed_store).
          super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
          super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_payload._M_value.
          second = (uint)local_b8._M_payload;
        }
        else {
          (this->delayed_store).
          super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
          super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_payload =
               (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)
               ((long)local_b8 << 0x20 | (ulong)*r);
          (this->delayed_store).
          super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
          super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged = true;
        }
        goto LAB_00176a85;
      }
    }
  }
  local_e8 = &PTR_display_001f0808;
  uVar5 = (uint)local_e0;
  local_e0 = (Reg *)CONCAT44(0xd,uVar5 & 0xffffff00);
  local_d8._M_rest = (_Variadic_union<short>)((short)this->stack_offset + (short)local_ac);
  local_c8 = 1;
  pp_Var14 = (_func_int **)operator_new(0x50);
  local_a0._0_8_ = &PTR_display_001f0808;
  local_a0._8_8_ = local_e0;
  std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_short>::_Move_ctor_base
            (&local_90,(_Move_ctor_base<false,_arm::RegisterOperand,_short> *)&local_d8._M_first);
  local_78._M_p._0_1_ = local_c0;
  CVar4 = this->cur_cond;
  *(undefined4 *)(pp_Var14 + 1) = 0x1a;
  *(ConditionCode *)((long)pp_Var14 + 0xc) = CVar4;
  *pp_Var14 = (_func_int *)&PTR_display_001f09c8;
  ((_Storage<unsigned_int,_true> *)(pp_Var14 + 2))->_M_value = (uint)local_b8._M_payload;
  pp_Var14[3] = (_func_int *)&PTR_display_001f0808;
  pp_Var14[4] = (_func_int *)local_a0._8_8_;
  local_108.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)(pp_Var14 + 5);
  *(undefined1 *)(pp_Var14 + 7) = 0xff;
  *(__index_type *)(pp_Var14 + 7) =
       local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
       super__Variant_storage_alias<arm::RegisterOperand,_short>._M_index;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_short>_&>
    ::_S_vtable._M_arr
    [(long)(char)local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                 super__Variant_storage_alias<arm::RegisterOperand,_short>._M_index + 1]._M_data)
            (&local_108,(variant<arm::RegisterOperand,_short> *)&local_90);
  *(bool *)(pp_Var14 + 8) = local_78._M_p._0_1_;
  *(undefined1 *)(pp_Var14 + 9) = 1;
  local_48._M_head_impl = (LoadStoreInst *)0x0;
  other = (MemoryOperand *)local_128;
  local_128._0_8_ = pp_Var14;
  std::
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
            ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
              *)&this->inst_sink,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)other);
  _Var19 = local_b8;
  if ((_func_int **)local_128._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_128._0_8_ + 0x10))();
  }
  local_128._0_8_ = (_func_int **)0x0;
  std::unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_>::~unique_ptr
            ((unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)&local_48);
LAB_00176a85:
  replace_read::anon_class_8_2_9473111c::operator()(&local_a8);
  local_129 = (ostream)0x0;
  AixLog::operator<<(&local_129,(Severity *)other);
  pRVar1 = &local_d8._M_first._M_storage.reg;
  local_e8 = &PTR__Tag_001edee0;
  local_d8._M_first._M_storage.super_Displayable._vptr_Displayable = (Displayable)(_func_int **)0x0;
  local_d8._M_first._M_storage.reg._0_1_ = 0;
  local_c0 = true;
  local_e0 = pRVar1;
  AixLog::operator<<((ostream *)&local_e8,(Tag *)other);
  local_40 = std::chrono::_V2::system_clock::now();
  local_48._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
  local_38 = 0;
  AixLog::operator<<((ostream *)&local_48,(Timestamp *)other);
  local_108.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"replace_read","");
  p_Var2 = (_Variadic_union<arm::RegisterOperand,_short> *)(local_128 + 0x10);
  pcVar17 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
  ;
  local_128._0_8_ = p_Var2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,"");
  local_a0._8_8_ =
       (long)&local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
              super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u + 8;
  local_a0._0_8_ = &PTR__Function_001edf10;
  if ((_Variadic_union<arm::RegisterOperand,_short> *)local_108.__lhs == &local_f8) {
    local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
    super__Variant_storage_alias<arm::RegisterOperand,_short>._16_8_ = local_f8._8_8_;
  }
  else {
    local_a0._8_8_ = local_108.__lhs;
  }
  local_78._M_p = (pointer)&local_68;
  local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
  super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u._M_first._M_storage.
  super_Displayable._vptr_Displayable = (Displayable)(Displayable)local_100._vptr_Displayable;
  local_100._vptr_Displayable = (_func_int **)0x0;
  local_f8._M_rest._M_first._M_storage._0_1_ = 0;
  if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128._0_8_ == p_Var2) {
    local_68._8_8_ = local_128._24_8_;
  }
  else {
    local_78._M_p = (pointer)local_128._0_8_;
  }
  local_70 = local_128._8_8_;
  local_128[8] = None;
  local_128._9_3_ = 0;
  local_128._12_4_ = 0;
  local_128[0x10] = 0;
  local_58 = 0x29b;
  local_50 = false;
  local_128._0_8_ = p_Var2;
  local_108.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_f8;
  AixLog::operator<<((ostream *)local_a0,(Function *)pcVar17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"spill ",6);
  poVar13 = (ostream *)std::ostream::operator<<(&std::clog,local_ac);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"with rd=",8);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_a0);
  if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128._0_8_ != p_Var2) {
    operator_delete((void *)local_128._0_8_,CONCAT71(local_128._17_7_,local_128[0x10]) + 1);
  }
  if ((_Variadic_union<arm::RegisterOperand,_short> *)local_108.__lhs != &local_f8) {
    operator_delete(local_108.__lhs,
                    CONCAT71(local_f8._1_7_,local_f8._M_rest._M_first._M_storage._0_1_) + 1);
  }
  local_e8 = &PTR__Tag_001edee0;
  if (local_e0 != pRVar1) {
    operator_delete(local_e0,CONCAT71(local_d8._9_7_,local_d8._M_first._M_storage.reg._0_1_) + 1);
  }
  *r = (Reg)_Var19._M_payload;
  return;
}

Assistant:

void RegAllocator::replace_read(Reg &r, int i,
                                std::optional<Reg> pre_alloc_transient) {
  auto disp_reg = [r, i]() {
    display_reg_name(LOG(TRACE), r);
    LOG(TRACE) << " at: " << i << " ";
  };
  r = get_collapse_reg(r);
  if (!is_virtual_register(r)) {
    disp_reg();
    LOG(TRACE) << "phys" << std::endl;
    return;
  } else if (auto reg_map_r = reg_map.find(r); reg_map_r != reg_map.end()) {
    // This register is allocated with graph-coloring
    disp_reg();
    LOG(TRACE) << "graph " << reg_map_r->second << std::endl;
    r = reg_map_r->second;
    return;
  } else if (auto spill_r = spilled_regs.find(r);
             spill_r != spilled_regs.end()) {
    // this register is allocated in stack
    bool del = false;

    Reg rd;
    auto spill_pos = get_or_alloc_spill_pos(r);
    auto interval = spill_r->second;
    interval.start = i;
    spilled_regs.erase(r);
    if (pre_alloc_transient) {
      rd = pre_alloc_transient.value();
    } else {
      rd = alloc_transient_reg(interval, r);
    }

    if (inst_sink.size() > 0) {
      auto &x = inst_sink.back();
      if (auto x_ = dynamic_cast<LoadStoreInst *>(&*x)) {
        if (auto x__ = std::get_if<MemoryOperand>(&x_->mem);
            x_->op == arm::OpCode::StR && x_->rd == rd &&
            (*x__) == MemoryOperand(REG_SP, spill_pos + stack_offset) &&
            x->cond == cur_cond) {
          del = true;
        }
      }
    }
    if (del) {
      inst_sink.pop_back();
      delayed_store = {{r, rd}};
    } else {
      inst_sink.push_back(std::make_unique<LoadStoreInst>(
          OpCode::LdR, rd, MemoryOperand(REG_SP, spill_pos + stack_offset),
          cur_cond));
    }
    disp_reg();
    LOG(TRACE) << "spill " << spill_pos << "with rd=" << rd << std::endl;
    r = rd;
    return;
  } else {
    // is temporary register
    auto live_interval = live_intervals.at(r);
    r = alloc_transient_reg(live_interval, r);
    disp_reg();
    LOG(TRACE) << "transient ";
    display_reg_name(LOG(TRACE), r);
    LOG(TRACE) << std::endl;
    return;
  }
}